

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

int AF_AActor_SetXYZ(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                    VMReturn *ret,int numret)

{
  void *pvVar1;
  _func_int **pp_Var2;
  bool bVar3;
  char *pcVar4;
  DObject *this;
  
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_0043759a;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this = (DObject *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this != (DObject *)0x0) {
        bVar3 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
        if (!bVar3) {
          pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0043759a;
        }
        goto LAB_00437531;
      }
    }
    else if (this != (DObject *)0x0) goto LAB_0043758a;
    this = (DObject *)0x0;
LAB_00437531:
    if (numparam == 1) {
      pcVar4 = "(paramnum) < numparam";
    }
    else {
      if (param[1].field_0.field_3.Type == '\x01') {
        if ((uint)numparam < 3) {
          pcVar4 = "(paramnum) < numparam";
        }
        else {
          if (param[2].field_0.field_3.Type == '\x01') {
            if (numparam == 3) {
              pcVar4 = "(paramnum) < numparam";
            }
            else {
              if (param[3].field_0.field_3.Type == '\x01') {
                pvVar1 = param[1].field_0.field_1.a;
                pp_Var2 = (_func_int **)param[2].field_0.field_1.a;
                this[2].Class = (PClass *)param[3].field_0.field_1.a;
                this[2]._vptr_DObject = pp_Var2;
                *(void **)&this[1].ObjectFlags = pvVar1;
                return 0;
              }
              pcVar4 = "param[paramnum].Type == REGT_FLOAT";
            }
            __assert_fail(pcVar4,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                          ,0x1e3e,
                          "int AF_AActor_SetXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          pcVar4 = "param[paramnum].Type == REGT_FLOAT";
        }
        __assert_fail(pcVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                      ,0x1e3d,
                      "int AF_AActor_SetXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
      }
      pcVar4 = "param[paramnum].Type == REGT_FLOAT";
    }
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1e3c,"int AF_AActor_SetXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_0043758a:
  pcVar4 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0043759a:
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x1e3b,"int AF_AActor_SetXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, SetXYZ)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(x);
	PARAM_FLOAT(y);
	PARAM_FLOAT(z);
	self->SetXYZ(x, y, z);
	return 0; 
}